

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *pNtk,int Id)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  Kit_DsdObj_t *pKVar8;
  
  if (-1 < Id) {
    uVar1 = pNtk->nVars;
    if (Id < (int)((uint)pNtk->nNodes + (uint)uVar1)) {
      if (Id < (int)(uint)uVar1) {
        pKVar8 = (Kit_DsdObj_t *)0x0;
      }
      else {
        pKVar8 = pNtk->pNodes[(long)Id - (ulong)uVar1];
      }
      iVar4 = 0;
      if (pKVar8 != (Kit_DsdObj_t *)0x0) {
        KVar2 = *pKVar8;
        uVar6 = (uint)KVar2 >> 6 & 7;
        iVar4 = 0;
        if ((1 < uVar6 - 1) && (0x7ffffff < (uint)KVar2)) {
          uVar3 = (uint)KVar2 >> 0x1a;
          if (uVar6 == 5) {
            iVar4 = 3;
            if (uVar3 != 3) {
              __assert_fail("(int)pObj->nFans == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                            ,0x743,"int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *, int)");
            }
          }
          else if (uVar6 == 4) {
            iVar4 = uVar3 * 3 + -3;
          }
          else {
            if (uVar6 != 3) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                            ,0x746,"int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *, int)");
            }
            iVar4 = uVar3 - 1;
          }
          if (0x3ffffff < (uint)*pKVar8) {
            uVar7 = 0;
            do {
              iVar5 = Kit_DsdCountAigNodes_rec
                                (pNtk,(uint)(*(ushort *)((long)&pKVar8[1].field_0x0 + uVar7 * 2) >>
                                            1));
              iVar4 = iVar4 + iVar5;
              uVar7 = uVar7 + 1;
            } while (uVar7 < (uint)*pKVar8 >> 0x1a);
          }
        }
      }
      return iVar4;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

int Kit_DsdCountAigNodes_rec( Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i, RetValue = 0;
    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
        return 0;
    if ( pObj->Type == KIT_DSD_CONST1 || pObj->Type == KIT_DSD_VAR )
        return 0;
    if ( pObj->nFans < 2 ) // why this happens? - need to figure out
        return 0; 
    assert( pObj->nFans > 1 );
    if ( pObj->Type == KIT_DSD_AND )
        RetValue = ((int)pObj->nFans - 1);
    else if ( pObj->Type == KIT_DSD_XOR )
        RetValue = ((int)pObj->nFans - 1) * 3;
    else if ( pObj->Type == KIT_DSD_PRIME )
    {
        // assuming MUX decomposition
        assert( (int)pObj->nFans == 3 );
        RetValue = 3;
    }
    else assert( 0 );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        RetValue += Kit_DsdCountAigNodes_rec( pNtk, Abc_Lit2Var(iLit) );
    return RetValue;
}